

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void floor_nz_3d(float32 ***m,uint32 d1,uint32 d2,uint32 d3,float32 floor)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  for (uVar2 = 0; uVar2 != d1; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar3 != d2; uVar3 = uVar3 + 1) {
      for (uVar4 = 0; d3 != uVar4; uVar4 = uVar4 + 1) {
        fVar1 = (float)m[uVar2][uVar3][uVar4];
        if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < (float)floor)) {
          m[uVar2][uVar3][uVar4] = floor;
        }
      }
    }
  }
  return;
}

Assistant:

void
floor_nz_3d(float32 ***m,
	    uint32 d1,
	    uint32 d2,
	    uint32 d3,
	    float32 floor)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		if ((m[i][j][k] != 0) && (m[i][j][k] < floor))
		    m[i][j][k] = floor;
	    }
	}
    }
}